

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.c
# Opt level: O1

void ff_min(flexfloat_t *dest,flexfloat_t *a,flexfloat_t *b)

{
  double dVar1;
  
  dVar1 = fmin(a->value,b->value);
  dest->value = dVar1;
  if ((a->value == 0.0) && (a->value == b->value)) {
    dest->value = -0.0;
  }
  flexfloat_sanitize(dest);
  return;
}

Assistant:

INLINE void ff_min(flexfloat_t *dest, const flexfloat_t *a, const flexfloat_t *b) {
    assert((dest->desc.exp_bits == a->desc.exp_bits) && (dest->desc.frac_bits == a->desc.frac_bits) &&
           (a->desc.exp_bits == b->desc.exp_bits) && (a->desc.frac_bits == b->desc.frac_bits));
    dest->value = fmin(a->value,b->value);
    // fmin's zero sign handling is implementation defined! Check for 0 cases and ensure -0 is chosen
    if ((a->value == 0) && (a->value == b->value))
        CAST_TO_INT(dest->value) = (UINT_C(0x1) << NUM_BITS-1);
    #ifdef FLEXFLOAT_TRACKING
    dest->exact_value = fmin(a->exact_value,b->exact_value);
    if ((a->exact_value == 0) && (a->exact_value == b->exact_value))
        CAST_TO_INT(dest->exact_value) = (UINT_C(0x1) << NUM_BITS-1);
    if(dest->tracking_fn) (dest->tracking_fn)(dest, dest->tracking_arg);
    #endif
    flexfloat_sanitize(dest);
    #ifdef FLEXFLOAT_STATS
    if(StatsEnabled) getOpStats(dest->desc)->minmax += 1;
    #endif
}